

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationHistory.cpp
# Opt level: O2

void __thiscall
ObservationHistory::ObservationHistory(ObservationHistory *this,Index obsI,ObservationHistory *pred)

{
  (this->super_IndividualHistory)._m_agentI = (pred->super_IndividualHistory)._m_agentI;
  (this->super_IndividualHistory).super_History._vptr_History =
       (_func_int **)&PTR__ObservationHistory_00601df8;
  this->_m_PlanningUnitMADPDiscrete = pred->_m_PlanningUnitMADPDiscrete;
  (this->super_IndividualHistory).super_History._m_length =
       (pred->super_IndividualHistory).super_History._m_length + 1;
  *(Index *)&(this->super_IndividualHistory).field_0x14 = obsI;
  this->_m_containsEmptyOI = false;
  this->_m_pred = pred;
  return;
}

Assistant:

ObservationHistory::ObservationHistory(Index obsI, ObservationHistory* pred):
    IndividualHistory(pred->_m_agentI),
    _m_PlanningUnitMADPDiscrete(pred->_m_PlanningUnitMADPDiscrete)
{
    SetLength(pred->GetLength() + 1);
    _m_observationI = obsI;
    _m_containsEmptyOI = false;
    _m_pred = pred;
}